

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdquery.cc
# Opt level: O1

void __thiscall bdQueryHistory::bdQueryHistory(bdQueryHistory *this)

{
  _Rb_tree_header *p_Var1;
  
  this->mStorePeriod = 600;
  p_Var1 = &(this->mHistory)._M_t._M_impl.super__Rb_tree_header;
  (this->mHistory)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mHistory)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mHistory)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mHistory)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->mHistory)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

bdQueryHistory::bdQueryHistory()
    :mStorePeriod(QUERY_HISTORY_PERIOD) {}